

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int verify_miniscript_or_b(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint uVar1;
  miniscript_node_t *pmVar2;
  miniscript_node_t *pmVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  iVar6 = 0;
  pmVar2 = node->child;
  for (pmVar3 = pmVar2; pmVar3 != (miniscript_node_t *)0x0; pmVar3 = pmVar3->next) {
    iVar6 = iVar6 + 1;
  }
  iVar4 = -2;
  if (iVar6 == node->info->inner_num) {
    uVar8 = pmVar2->type_properties;
    uVar1 = pmVar2->next->type_properties;
    uVar5 = uVar1 & uVar8;
    uVar7 = uVar1 | uVar8;
    uVar8 = (uVar7 * 2 & uVar7 & 0x200) +
            ((uint)((~uVar1 & 0x808) == 0 && (~uVar8 & 0x801) == 0) | uVar5 & 0xa100) + 0x21800;
    node->type_properties = uVar8;
    iVar4 = 0;
    if (((short)uVar7 < 0) && ((uVar5 & 0x2000) != 0)) {
      node->type_properties = uVar8 | uVar5 & 0x10000;
    }
  }
  return iVar4;
}

Assistant:

static int verify_miniscript_or_b(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    uint32_t x_prop, y_prop;
    int ret = verify_miniscript_two_param_check(node, parent);
    if (ret != WALLY_OK)
        return ret;

    x_prop = node->child->type_properties;
    y_prop = node->child->next->type_properties;
    node->type_properties = MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_U | MINISCRIPT_PROPERTY_X;
    node->type_properties |= x_prop & y_prop &
                             (MINISCRIPT_PROPERTY_Z | MINISCRIPT_PROPERTY_S | MINISCRIPT_PROPERTY_E);
    if (!(~x_prop & (MINISCRIPT_TYPE_B | MINISCRIPT_PROPERTY_D)) &&
        !(~y_prop & (MINISCRIPT_TYPE_W | MINISCRIPT_PROPERTY_D)))
        node->type_properties |= MINISCRIPT_TYPE_B;
    if ((x_prop | y_prop) & MINISCRIPT_PROPERTY_Z)
        node->type_properties |= (x_prop | y_prop) & MINISCRIPT_PROPERTY_O;
    if (((x_prop | y_prop) & MINISCRIPT_PROPERTY_S) &&
        ((x_prop & y_prop) & MINISCRIPT_PROPERTY_E))
        node->type_properties |= x_prop & y_prop & MINISCRIPT_PROPERTY_M;

    return WALLY_OK;
}